

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_after_frame_sent1(nghttp2_session *session)

{
  nghttp2_frame *frame_00;
  int iVar1;
  int iVar2;
  nghttp2_stream *pnVar3;
  nghttp2_goaway_aux_data *aux_data_2;
  nghttp2_headers_aux_data *aux_data_1;
  int stream_closed;
  nghttp2_data_aux_data *aux_data;
  nghttp2_stream *stream;
  nghttp2_frame *frame;
  nghttp2_bufs *framebufs;
  nghttp2_outbound_item *item;
  nghttp2_active_outbound_item *aob;
  int rv;
  nghttp2_session *session_local;
  
  frame_00 = &((session->aob).item)->frame;
  if ((frame_00->hd).type == '\0') {
    pnVar3 = nghttp2_session_get_stream(session,(frame_00->hd).stream_id);
    session->remote_window_size = session->remote_window_size - (int)(frame_00->hd).length;
    if ((pnVar3 != (nghttp2_stream *)0x0) &&
       (pnVar3->remote_window_size = pnVar3->remote_window_size - (int)(frame_00->hd).length,
       *(char *)((long)frame_00 + 0x71) != '\0')) {
      iVar1 = session_detach_stream_item(session,pnVar3);
      iVar2 = nghttp2_is_fatal(iVar1);
      if (iVar2 != 0) {
        return iVar1;
      }
      if ((session->callbacks).on_frame_send_callback != (nghttp2_on_frame_send_callback)0x0) {
        iVar1 = session_call_on_frame_send(session,frame_00);
        iVar2 = nghttp2_is_fatal(iVar1);
        if (iVar2 != 0) {
          return iVar1;
        }
      }
      if (((frame_00->hd).flags & 1) != 0) {
        nghttp2_stream_shutdown(pnVar3,NGHTTP2_SHUT_WR);
        iVar1 = nghttp2_session_close_stream_if_shut_rdwr(session,pnVar3);
        iVar2 = nghttp2_is_fatal(iVar1);
        if (iVar2 != 0) {
          return iVar1;
        }
      }
      return 0;
    }
    if ((session->callbacks).on_frame_send_callback != (nghttp2_on_frame_send_callback)0x0) {
      iVar1 = session_call_on_frame_send(session,frame_00);
      iVar2 = nghttp2_is_fatal(iVar1);
      if (iVar2 != 0) {
        return iVar1;
      }
    }
    return 0;
  }
  if ((((frame_00->hd).type == '\x01') || ((frame_00->hd).type == '\x05')) &&
     (iVar1 = nghttp2_bufs_next_present(&(session->aob).framebufs), iVar1 != 0)) {
    return 0;
  }
  iVar1 = session_call_on_frame_send(session,frame_00);
  iVar2 = nghttp2_is_fatal(iVar1);
  if (iVar2 != 0) {
    return iVar1;
  }
  switch((frame_00->hd).type) {
  case '\x01':
    pnVar3 = nghttp2_session_get_stream(session,(frame_00->hd).stream_id);
    if (pnVar3 == (nghttp2_stream *)0x0) {
      return 0;
    }
    switch((frame_00->headers).cat) {
    case NGHTTP2_HCAT_REQUEST:
      break;
    case NGHTTP2_HCAT_PUSH_RESPONSE:
      pnVar3->flags = pnVar3->flags & 0xfe;
      session->num_outgoing_streams = session->num_outgoing_streams + 1;
    case NGHTTP2_HCAT_RESPONSE:
      pnVar3->state = NGHTTP2_STREAM_OPENED;
    case NGHTTP2_HCAT_HEADERS:
      if (((frame_00->hd).flags & 1) != 0) {
        nghttp2_stream_shutdown(pnVar3,NGHTTP2_SHUT_WR);
      }
      session_local._4_4_ = nghttp2_session_close_stream_if_shut_rdwr(session,pnVar3);
      iVar1 = nghttp2_is_fatal(session_local._4_4_);
      if (iVar1 == 0) {
        if (*(long *)((long)frame_00 + 0x68) != 0) {
          iVar1 = nghttp2_submit_data(session,'\x01',(frame_00->hd).stream_id,
                                      (nghttp2_data_provider *)((long)frame_00 + 0x60));
          iVar2 = nghttp2_is_fatal(iVar1);
          if (iVar2 != 0) {
            return iVar1;
          }
        }
        session_local._4_4_ = 0;
      }
      return session_local._4_4_;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0xbda,"int session_after_frame_sent1(nghttp2_session *)");
    }
  case '\x02':
    if ((session->server != '\0') || (session->pending_no_rfc7540_priorities == '\x01')) {
      return 0;
    }
    pnVar3 = nghttp2_session_get_stream_raw(session,(frame_00->hd).stream_id);
    if (pnVar3 == (nghttp2_stream *)0x0) {
      iVar1 = session_detect_idle_stream(session,(frame_00->hd).stream_id);
      if (iVar1 == 0) {
        return 0;
      }
      pnVar3 = nghttp2_session_open_stream
                         (session,(frame_00->hd).stream_id,'\0',&(frame_00->priority).pri_spec,
                          NGHTTP2_STREAM_IDLE,(void *)0x0);
      if (pnVar3 == (nghttp2_stream *)0x0) {
        return -0x385;
      }
    }
    else {
      iVar1 = nghttp2_session_reprioritize_stream(session,pnVar3,&(frame_00->priority).pri_spec);
      iVar2 = nghttp2_is_fatal(iVar1);
      if (iVar2 != 0) {
        return iVar1;
      }
    }
    iVar1 = nghttp2_session_adjust_idle_stream(session);
    iVar2 = nghttp2_is_fatal(iVar1);
    if (iVar2 != 0) {
      return iVar1;
    }
    return 0;
  case '\x03':
    iVar1 = nghttp2_session_close_stream
                      (session,(frame_00->hd).stream_id,(frame_00->rst_stream).error_code);
    iVar2 = nghttp2_is_fatal(iVar1);
    if (iVar2 != 0) {
      return iVar1;
    }
    return 0;
  default:
    return 0;
  case '\a':
    if ((*(byte *)((long)frame_00 + 0x60) & 2) == 0) {
      if ((*(byte *)((long)frame_00 + 0x60) & 1) != 0) {
        session->goaway_flags = session->goaway_flags | 2;
      }
      session->goaway_flags = session->goaway_flags | 4;
      iVar1 = session_close_stream_on_goaway(session,(frame_00->priority).pri_spec.stream_id,1);
      iVar2 = nghttp2_is_fatal(iVar1);
      if (iVar2 != 0) {
        return iVar1;
      }
    }
    return 0;
  case '\b':
    goto switchD_00a55082_caseD_8;
  }
  pnVar3->state = NGHTTP2_STREAM_OPENING;
  if (((frame_00->hd).flags & 1) != 0) {
    nghttp2_stream_shutdown(pnVar3,NGHTTP2_SHUT_WR);
  }
  iVar1 = nghttp2_session_close_stream_if_shut_rdwr(session,pnVar3);
  iVar2 = nghttp2_is_fatal(iVar1);
  if (iVar2 != 0) {
    return iVar1;
  }
  if (*(long *)((long)frame_00 + 0x68) != 0) {
    iVar1 = nghttp2_submit_data(session,'\x01',(frame_00->hd).stream_id,
                                (nghttp2_data_provider *)((long)frame_00 + 0x60));
    iVar2 = nghttp2_is_fatal(iVar1);
    if (iVar2 != 0) {
      return iVar1;
    }
  }
  return 0;
switchD_00a55082_caseD_8:
  if ((frame_00->hd).stream_id == 0) {
    session->window_update_queued = '\0';
    if ((session->opt_flags & 1) == 0) {
      aob._4_4_ = nghttp2_session_update_recv_connection_window_size(session,0);
    }
    else {
      aob._4_4_ = session_update_connection_consumed_size(session,0);
    }
    iVar1 = nghttp2_is_fatal(aob._4_4_);
    if (iVar1 != 0) {
      return aob._4_4_;
    }
    return 0;
  }
  pnVar3 = nghttp2_session_get_stream(session,(frame_00->hd).stream_id);
  if (pnVar3 == (nghttp2_stream *)0x0) {
    return 0;
  }
  pnVar3->window_update_queued = '\0';
  if ((pnVar3->shut_flags & 1) != 0) {
    return 0;
  }
  if ((session->opt_flags & 1) == 0) {
    aob._4_4_ = nghttp2_session_update_recv_stream_window_size(session,pnVar3,0,1);
  }
  else {
    aob._4_4_ = session_update_stream_consumed_size(session,pnVar3,0);
  }
  iVar1 = nghttp2_is_fatal(aob._4_4_);
  if (iVar1 != 0) {
    return aob._4_4_;
  }
  return 0;
}

Assistant:

static int session_after_frame_sent1(nghttp2_session *session) {
  int rv;
  nghttp2_active_outbound_item *aob = &session->aob;
  nghttp2_outbound_item *item = aob->item;
  nghttp2_bufs *framebufs = &aob->framebufs;
  nghttp2_frame *frame;
  nghttp2_stream *stream;

  frame = &item->frame;

  if (frame->hd.type == NGHTTP2_DATA) {
    nghttp2_data_aux_data *aux_data;

    aux_data = &item->aux_data.data;

    stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
    /* We update flow control window after a frame was completely
       sent. This is possible because we choose payload length not to
       exceed the window */
    session->remote_window_size -= (int32_t)frame->hd.length;
    if (stream) {
      stream->remote_window_size -= (int32_t)frame->hd.length;
    }

    if (stream && aux_data->eof) {
      rv = session_detach_stream_item(session, stream);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      /* Call on_frame_send_callback after
         nghttp2_stream_detach_item(), so that application can issue
         nghttp2_submit_data() in the callback. */
      if (session->callbacks.on_frame_send_callback) {
        rv = session_call_on_frame_send(session, frame);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
      }

      if (frame->hd.flags & NGHTTP2_FLAG_END_STREAM) {
        int stream_closed;

        stream_closed =
            (stream->shut_flags & NGHTTP2_SHUT_RDWR) == NGHTTP2_SHUT_RDWR;

        nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_WR);

        rv = nghttp2_session_close_stream_if_shut_rdwr(session, stream);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
        /* stream may be NULL if it was closed */
        if (stream_closed) {
          stream = NULL;
        }
      }
      return 0;
    }

    if (session->callbacks.on_frame_send_callback) {
      rv = session_call_on_frame_send(session, frame);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
    }

    return 0;
  }

  /* non-DATA frame */

  if (frame->hd.type == NGHTTP2_HEADERS ||
      frame->hd.type == NGHTTP2_PUSH_PROMISE) {
    if (nghttp2_bufs_next_present(framebufs)) {
      DEBUGF("send: CONTINUATION exists, just return\n");
      return 0;
    }
  }
  rv = session_call_on_frame_send(session, frame);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }
  switch (frame->hd.type) {
  case NGHTTP2_HEADERS: {
    nghttp2_headers_aux_data *aux_data;

    stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
    if (!stream) {
      return 0;
    }

    switch (frame->headers.cat) {
    case NGHTTP2_HCAT_REQUEST: {
      stream->state = NGHTTP2_STREAM_OPENING;
      if (frame->hd.flags & NGHTTP2_FLAG_END_STREAM) {
        nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_WR);
      }
      rv = nghttp2_session_close_stream_if_shut_rdwr(session, stream);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
      /* We assume aux_data is a pointer to nghttp2_headers_aux_data */
      aux_data = &item->aux_data.headers;
      if (aux_data->data_prd.read_callback) {
        /* nghttp2_submit_data() makes a copy of aux_data->data_prd */
        rv = nghttp2_submit_data(session, NGHTTP2_FLAG_END_STREAM,
                                 frame->hd.stream_id, &aux_data->data_prd);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
        /* TODO nghttp2_submit_data() may fail if stream has already
           DATA frame item.  We might have to handle it here. */
      }
      return 0;
    }
    case NGHTTP2_HCAT_PUSH_RESPONSE:
      stream->flags = (uint8_t)(stream->flags & ~NGHTTP2_STREAM_FLAG_PUSH);
      ++session->num_outgoing_streams;
    /* Fall through */
    case NGHTTP2_HCAT_RESPONSE:
      stream->state = NGHTTP2_STREAM_OPENED;
    /* Fall through */
    case NGHTTP2_HCAT_HEADERS:
      if (frame->hd.flags & NGHTTP2_FLAG_END_STREAM) {
        nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_WR);
      }
      rv = nghttp2_session_close_stream_if_shut_rdwr(session, stream);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
      /* We assume aux_data is a pointer to nghttp2_headers_aux_data */
      aux_data = &item->aux_data.headers;
      if (aux_data->data_prd.read_callback) {
        rv = nghttp2_submit_data(session, NGHTTP2_FLAG_END_STREAM,
                                 frame->hd.stream_id, &aux_data->data_prd);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
        /* TODO nghttp2_submit_data() may fail if stream has already
           DATA frame item.  We might have to handle it here. */
      }
      return 0;
    default:
      /* Unreachable */
      assert(0);
      return 0;
    }
  }
  case NGHTTP2_PRIORITY:
    if (session->server || session->pending_no_rfc7540_priorities == 1) {
      return 0;
    }

    stream = nghttp2_session_get_stream_raw(session, frame->hd.stream_id);

    if (!stream) {
      if (!session_detect_idle_stream(session, frame->hd.stream_id)) {
        return 0;
      }

      stream = nghttp2_session_open_stream(
          session, frame->hd.stream_id, NGHTTP2_FLAG_NONE,
          &frame->priority.pri_spec, NGHTTP2_STREAM_IDLE, NULL);
      if (!stream) {
        return NGHTTP2_ERR_NOMEM;
      }
    } else {
      rv = nghttp2_session_reprioritize_stream(session, stream,
                                               &frame->priority.pri_spec);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
    }

    rv = nghttp2_session_adjust_idle_stream(session);

    if (nghttp2_is_fatal(rv)) {
      return rv;
    }

    return 0;
  case NGHTTP2_RST_STREAM:
    rv = nghttp2_session_close_stream(session, frame->hd.stream_id,
                                      frame->rst_stream.error_code);
    if (nghttp2_is_fatal(rv)) {
      return rv;
    }
    return 0;
  case NGHTTP2_GOAWAY: {
    nghttp2_goaway_aux_data *aux_data;

    aux_data = &item->aux_data.goaway;

    if ((aux_data->flags & NGHTTP2_GOAWAY_AUX_SHUTDOWN_NOTICE) == 0) {

      if (aux_data->flags & NGHTTP2_GOAWAY_AUX_TERM_ON_SEND) {
        session->goaway_flags |= NGHTTP2_GOAWAY_TERM_SENT;
      }

      session->goaway_flags |= NGHTTP2_GOAWAY_SENT;

      rv = session_close_stream_on_goaway(session, frame->goaway.last_stream_id,
                                          1);

      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
    }

    return 0;
  }
  case NGHTTP2_WINDOW_UPDATE:
    if (frame->hd.stream_id == 0) {
      session->window_update_queued = 0;
      if (session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE) {
        rv = session_update_connection_consumed_size(session, 0);
      } else {
        rv = nghttp2_session_update_recv_connection_window_size(session, 0);
      }

      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      return 0;
    }

    stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
    if (!stream) {
      return 0;
    }

    stream->window_update_queued = 0;

    /* We don't have to send WINDOW_UPDATE if END_STREAM from peer
       is seen. */
    if (stream->shut_flags & NGHTTP2_SHUT_RD) {
      return 0;
    }

    if (session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE) {
      rv = session_update_stream_consumed_size(session, stream, 0);
    } else {
      rv =
          nghttp2_session_update_recv_stream_window_size(session, stream, 0, 1);
    }

    if (nghttp2_is_fatal(rv)) {
      return rv;
    }

    return 0;
  default:
    return 0;
  }
}